

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL Js::JavascriptArray::TemplatedGetItem<Js::JavascriptNativeIntArray>
               (JavascriptNativeIntArray *pArr,uint32 index,Var *element,
               ScriptContext *scriptContext,bool checkHasItem)

{
  FinalizableObject FVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  
  FVar1.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (pArr->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
       super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
       super_IRecyclerVisitedObject;
  if ((FVar1.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
       (IRecyclerVisitedObject)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address) &&
     (FVar1.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
      (IRecyclerVisitedObject)
      VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x103d,
                                "(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pArr) || VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(pArr))"
                                ,
                                "VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pArr) || VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(pArr)"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  BVar4 = JavascriptNativeIntArray::DirectGetItemAtFull(pArr,index,element);
  return BVar4;
}

Assistant:

BOOL JavascriptArray::TemplatedGetItem(JavascriptNativeIntArray *pArr, uint32 index, Var * element, ScriptContext * scriptContext, bool checkHasItem)
    {
        Assert(VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(pArr)
            || VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::HasVirtualTable(pArr));
        return pArr->JavascriptNativeIntArray::DirectGetItemAtFull(index, element);
    }